

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O3

int parsenetrc(char *host,char **loginp,char **passwordp,_Bool *login_changed,
              _Bool *password_changed,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  FILE *__stream;
  char *pcVar7;
  char *__s1;
  char *first;
  char cVar8;
  bool bVar9;
  char *tok_buf;
  char netrcbuffer [4096];
  int local_108c;
  int local_1084;
  char *local_1078;
  char *local_1040;
  char local_1038 [4104];
  
  __s1 = *loginp;
  if (__s1 == (char *)0x0) {
    bVar9 = false;
  }
  else {
    bVar9 = *__s1 != '\0';
  }
  local_1078 = *passwordp;
  __stream = fopen64(netrcfile,"r");
  if (__stream == (FILE *)0x0) {
    local_1084 = 1;
  }
  else {
    local_1084 = 1;
    local_108c = 0;
    bVar2 = false;
    bVar3 = false;
    cVar8 = '\0';
    bVar5 = false;
    bVar4 = false;
LAB_00121c4d:
    do {
      pcVar7 = fgets(local_1038,0x1000,__stream);
      if (pcVar7 == (char *)0x0) break;
      pcVar7 = strtok_r(local_1038," \t\n",&local_1040);
      if (pcVar7 == (char *)0x0) {
        bVar1 = false;
      }
      else {
        if (*pcVar7 == '#') goto LAB_00121c4d;
        do {
          if (((__s1 != (char *)0x0) && (local_1078 != (char *)0x0 && *__s1 != '\0')) &&
             (*local_1078 != '\0')) {
            bVar1 = true;
            break;
          }
          if (cVar8 == '\x02') {
            if (bVar3) {
              if (bVar9) {
                local_108c = Curl_strcasecompare(__s1,pcVar7);
              }
              else if ((__s1 == (char *)0x0) || (iVar6 = strcmp(__s1,pcVar7), iVar6 != 0)) {
                if (bVar4) {
                  (*Curl_cfree)(__s1);
                  bVar4 = false;
                }
                __s1 = (*Curl_cstrdup)(pcVar7);
                if (__s1 != (char *)0x0) {
                  bVar3 = false;
                  cVar8 = '\x02';
                  bVar4 = true;
                  goto LAB_00121ede;
                }
                local_1084 = -1;
                __s1 = (char *)0x0;
                goto LAB_00121f27;
              }
              cVar8 = '\x02';
              bVar3 = false;
            }
            else {
              if (bVar2) {
                cVar8 = '\x02';
                if ((bool)(bVar9 & local_108c == 0)) {
                  bVar3 = false;
                  bVar2 = false;
                  local_108c = 0;
                  goto LAB_00121ede;
                }
                if ((local_1078 == (char *)0x0) || (iVar6 = strcmp(local_1078,pcVar7), iVar6 != 0))
                {
                  if (bVar5) {
                    (*Curl_cfree)(local_1078);
                    bVar5 = false;
                  }
                  local_1078 = (*Curl_cstrdup)(pcVar7);
                  if (local_1078 == (char *)0x0) {
                    local_1084 = -1;
                    local_1078 = (char *)0x0;
                    goto LAB_00121f27;
                  }
                  bVar3 = false;
                  bVar5 = true;
                }
                else {
                  bVar3 = false;
                }
              }
              else {
                iVar6 = Curl_strcasecompare("login",pcVar7);
                cVar8 = '\x02';
                if (iVar6 == 0) {
                  iVar6 = Curl_strcasecompare("password",pcVar7);
                  if (iVar6 != 0) {
                    bVar3 = false;
                    bVar2 = true;
                    goto LAB_00121ede;
                  }
                  iVar6 = Curl_strcasecompare("machine",pcVar7);
                  bVar3 = false;
                  if (iVar6 != 0) {
                    local_108c = 0;
                  }
                  cVar8 = (iVar6 == 0) + '\x01';
                }
                else {
                  bVar3 = true;
                }
              }
              bVar2 = false;
            }
          }
          else {
            first = host;
            if (cVar8 != '\x01') {
              iVar6 = Curl_strcasecompare("machine",pcVar7);
              cVar8 = '\x01';
              if (iVar6 != 0) goto LAB_00121ede;
              first = "default";
            }
            iVar6 = Curl_strcasecompare(first,pcVar7);
            if (iVar6 != 0) {
              local_1084 = 0;
            }
            cVar8 = (iVar6 != 0) * '\x02';
          }
LAB_00121ede:
          bVar1 = false;
          pcVar7 = strtok_r((char *)0x0," \t\n",&local_1040);
        } while (pcVar7 != (char *)0x0);
      }
    } while (!bVar1);
    if (local_1084 == 0) {
      local_1084 = 0;
      *login_changed = false;
      *password_changed = false;
      if (bVar4) {
        if (*loginp != (char *)0x0) {
          (*Curl_cfree)(*loginp);
        }
        *loginp = __s1;
        *login_changed = true;
      }
      if (bVar5) {
        if (*passwordp != (char *)0x0) {
          (*Curl_cfree)(*passwordp);
        }
        *passwordp = local_1078;
        *password_changed = true;
      }
    }
    else {
LAB_00121f27:
      if (bVar4) {
        (*Curl_cfree)(__s1);
      }
      if (bVar5) {
        (*Curl_cfree)(local_1078);
      }
    }
    fclose(__stream);
  }
  return local_1084;
}

Assistant:

static int parsenetrc(const char *host,
                      char **loginp,
                      char **passwordp,
                      bool *login_changed,
                      bool *password_changed,
                      char *netrcfile)
{
  FILE *file;
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = FALSE;  /* With specific_login, found *our* login
                                   name */

  DEBUGASSERT(netrcfile);

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(file) {
    char *tok;
    char *tok_buf;
    bool done = FALSE;
    char netrcbuffer[4096];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok = strtok_r(netrcbuffer, " \t\n", &tok_buf);
      if(tok && *tok == '#')
        /* treat an initial hash as a comment line */
        continue;
      while(tok) {

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = strcasecompare(login, tok);
            }
            else if(!login || strcmp(login, tok)) {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if((state_our_login || !specific_login)
                && (!password || strcmp(password, tok))) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    out:
    if(!retcode) {
      /* success */
      *login_changed = FALSE;
      *password_changed = FALSE;
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
        *login_changed = TRUE;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
        *password_changed = TRUE;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}